

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::TextureVkImpl::TextureVkImpl
          (TextureVkImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceVkImpl *pDeviceVk,
          TextureDesc *TexDesc,RESOURCE_STATE InitialState,VkImage VkImageHandle)

{
  RESOURCE_STATE InitialState_local;
  TextureDesc *TexDesc_local;
  RenderDeviceVkImpl *pDeviceVk_local;
  FixedBlockMemoryAllocator *TexViewObjAllocator_local;
  IReferenceCounters *pRefCounters_local;
  TextureVkImpl *this_local;
  
  TextureBase<Diligent::EngineVkImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineVkImplTraits>,pRefCounters,TexViewObjAllocator
             ,pDeviceVk,TexDesc,false);
  (this->super_TextureBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureVk>.super_RefCountedObject<Diligent::ITextureVk>.
  super_ITextureVk.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_0139e8e0;
  VulkanUtilities::VulkanObjectWrapper<VkImage_T_*,_(VulkanUtilities::VulkanHandleTypeId)4>::
  VulkanObjectWrapper(&this->m_VulkanImage,VkImageHandle);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  VulkanObjectWrapper(&this->m_StagingBuffer);
  VulkanUtilities::VulkanMemoryAllocation::VulkanMemoryAllocation(&this->m_MemoryAllocation);
  this->m_StagingDataAlignedOffset = 0;
  TextureBase<Diligent::EngineVkImplTraits>::SetState
            (&this->super_TextureBase<Diligent::EngineVkImplTraits>,InitialState);
  if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.Usage == USAGE_SPARSE) {
    InitSparseProperties(this);
  }
  return;
}

Assistant:

TextureVkImpl::TextureVkImpl(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceVkImpl*        pDeviceVk,
                             const TextureDesc&         TexDesc,
                             RESOURCE_STATE             InitialState,
                             VkImage                    VkImageHandle) :
    TTextureBase{pRefCounters, TexViewObjAllocator, pDeviceVk, TexDesc},
    m_VulkanImage{VkImageHandle}
{
    SetState(InitialState);

    if (m_Desc.Usage == USAGE_SPARSE)
        InitSparseProperties();
}